

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestCase::checkSampleCount
          (FboTestCase *this,deUint32 sizedFormat,int numSamples)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  NotSupportedError *this_00;
  uint uVar4;
  allocator<char> local_5d;
  int numSamples_local;
  vector<int,_std::allocator<int>_> supportedSampleCounts;
  string local_38;
  long lVar2;
  
  iVar1 = 4;
  uVar4 = sizedFormat - 0x8229;
  if (uVar4 < 0x14) {
    if ((0xfff55U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_0112b247;
    if ((0xa0U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0112b190;
  }
  else {
LAB_0112b190:
    if (((((sizedFormat - 0x8d62 < 0x2d) &&
          ((0x104104104001U >> ((ulong)(sizedFormat - 0x8d62) & 0x3f) & 1) != 0)) ||
         ((sizedFormat - 0x8051 < 9 && ((0x1e1U >> (sizedFormat - 0x8051 & 0x1f) & 1) != 0)))) ||
        ((sizedFormat - 0x81a5 < 2 || (sizedFormat - 0x8cac < 2)))) ||
       ((sizedFormat != 0x8814 &&
        ((sizedFormat == 0x906f ||
         ((sizedFormat != 0x881b &&
          ((((sizedFormat == 0x88f0 || (sizedFormat == 0x8c3a)) || (sizedFormat == 0x8c43)) ||
           (sizedFormat == 0x8d48)))))))))) goto LAB_0112b247;
  }
  iVar1 = 0;
LAB_0112b247:
  if (iVar1 < numSamples) {
    numSamples_local = numSamples;
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    local_38._M_dataplus._M_p._0_4_ = 0;
    supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(lVar2 + 0x880))(0x8d41,sizedFormat,0x9380,1);
    if (0 < (long)(int)local_38._M_dataplus._M_p) {
      std::vector<int,_std::allocator<int>_>::resize
                (&supportedSampleCounts,(long)(int)local_38._M_dataplus._M_p);
      (**(code **)(lVar2 + 0x880))
                (0x8d41,sizedFormat,0x80a9,
                 (ulong)((long)supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
    }
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"Failed to query sample counts for format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                    ,0x15c);
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&numSamples_local);
    if (_Var3._M_current ==
        supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Sample count not supported",&local_5d);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void FboTestCase::checkSampleCount (deUint32 sizedFormat, int numSamples)
{
	const int minSampleCount = getMinimumSampleCount(sizedFormat);

	if (numSamples > minSampleCount)
	{
		// Exceeds spec-mandated minimum - need to check.
		const std::vector<int> supportedSampleCounts = querySampleCounts(m_context.getRenderContext().getFunctions(), sizedFormat);

		if (std::find(supportedSampleCounts.begin(), supportedSampleCounts.end(), numSamples) == supportedSampleCounts.end())
			throw tcu::NotSupportedError("Sample count not supported");
	}
}